

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QTimeEdit::QTimeEdit(QTimeEdit *this,QWidget *parent)

{
  long lVar1;
  QVariant *in_RSI;
  QDateTimeEdit *in_RDI;
  long in_FS_OFFSET;
  ConnectionType in_stack_00000010;
  QWidget *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  Type parserType;
  QDateTimeEdit *this_00;
  Connection in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  QTime in_stack_ffffffffffffffd4;
  offset_in_QDateTimeEdit_to_subr in_stack_fffffffffffffff0;
  
  parserType = (Type)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QTime::QTime((QTime *)&stack0xffffffffffffffd4,0,0,0,0);
  ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd4);
  QDateTimeEdit::QDateTimeEdit(this_00,in_RSI,parserType,in_stack_ffffffffffffff98);
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  *(undefined ***)&(in_RDI->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00d11ec8;
  *(undefined ***)&(in_RDI->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QTimeEdit_00d120b8;
  QObject::connect<void(QDateTimeEdit::*)(QTime),void(QTimeEdit::*)(QTime)>
            ((Object *)CONCAT44(in_stack_ffffffffffffffd4.mds,in_stack_ffffffffffffffd0),
             in_stack_fffffffffffffff0,(ContextType *)in_stack_ffffffffffffffc8.d_ptr,
             (offset_in_QTimeEdit_to_subr *)0x0,in_stack_00000010);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTimeEdit::QTimeEdit(QWidget *parent)
    : QDateTimeEdit(QDATETIMEEDIT_TIME_MIN, QMetaType::QTime, parent)
{
    connect(this, &QTimeEdit::timeChanged, this, &QTimeEdit::userTimeChanged);
}